

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O3

void Cec_ManPatComputePattern4_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  ulong uVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  
  pGVar3 = p->pObjs;
  if (pGVar3 <= pObj) {
    do {
      if (pGVar3 + p->nObjs <= pObj) break;
      iVar4 = (int)((long)pObj - (long)pGVar3 >> 2) * -0x55555555;
      if (p->nTravIdsAlloc <= iVar4) {
        __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x23c,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
      }
      if (p->pTravIds[iVar4] == p->nTravIds) {
        return;
      }
      p->pTravIds[iVar4] = p->nTravIds;
      uVar1 = *(ulong *)pObj;
      *(ulong *)pObj = uVar1 & 0xffffffffbfffffff;
      uVar2 = (uint)uVar1;
      if ((~uVar2 & 0x9fffffff) == 0) {
        return;
      }
      if (((int)uVar2 < 0) || ((uVar2 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecPat.c"
                      ,0x145,"void Cec_ManPatComputePattern4_rec(Gia_Man_t *, Gia_Obj_t *)");
      }
      Cec_ManPatComputePattern4_rec(p,pObj + -(ulong)(uVar2 & 0x1fffffff));
      pObj = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
      pGVar3 = p->pObjs;
    } while (pGVar3 <= pObj);
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Cec_ManPatComputePattern4_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    pObj->fMark0 = 0;
    if ( Gia_ObjIsCi(pObj) )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    Cec_ManPatComputePattern4_rec( p, Gia_ObjFanin0(pObj) );
    Cec_ManPatComputePattern4_rec( p, Gia_ObjFanin1(pObj) );
}